

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O1

ICHUll * __thiscall HACD::ICHUll::operator=(ICHUll *this,ICHUll *rhs)

{
  if (rhs != this) {
    TMMesh::Copy(&this->m_mesh,&rhs->m_mesh);
    std::
    vector<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
    ::operator=(&this->m_edgesToDelete,&rhs->m_edgesToDelete);
    std::
    vector<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
    ::operator=(&this->m_edgesToUpdate,&rhs->m_edgesToUpdate);
    std::
    vector<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
    ::operator=(&this->m_trianglesToDelete,&rhs->m_trianglesToDelete);
    this->m_isFlat = rhs->m_isFlat;
    this->m_heapManager = rhs->m_heapManager;
  }
  return this;
}

Assistant:

const ICHUll & ICHUll::operator=(ICHUll & rhs)
    {
        if (&rhs != this)
        {
            m_mesh.Copy(rhs.m_mesh);
            m_edgesToDelete = rhs.m_edgesToDelete;
            m_edgesToUpdate = rhs.m_edgesToUpdate;
            m_trianglesToDelete = rhs.m_trianglesToDelete;
			m_isFlat = rhs.m_isFlat;
            m_heapManager = rhs.m_heapManager;
        }
        return (*this);
    }